

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

void __thiscall
google::protobuf::
hash_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
::hash_map(hash_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
           *this,int a,
          PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_> *b,
          equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_> *c,
          allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>
          *d)

{
  ulong __bkt_count;
  __buckets_ptr pp_Var1;
  
  (this->
  super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  )._M_h._M_buckets =
       &(this->
        super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
        )._M_h._M_single_bucket;
  (this->
  super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  )._M_h._M_bucket_count = 1;
  (this->
  super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->
  super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  )._M_h._M_element_count = 0;
  (this->
  super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  )._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->
  super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  )._M_h._M_rehash_policy._M_next_resize = 0;
  (this->
  super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  )._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __bkt_count = std::__detail::_Prime_rehash_policy::_M_next_bkt
                          ((ulong)&(this->
                                   super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                   )._M_h._M_rehash_policy);
  if ((this->
      super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
      )._M_h._M_bucket_count < __bkt_count) {
    pp_Var1 = std::
              _Hashtable<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_allocate_buckets
                        ((_Hashtable<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)this,__bkt_count);
    (this->
    super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
    )._M_h._M_buckets = pp_Var1;
    (this->
    super_unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
    )._M_h._M_bucket_count = __bkt_count;
  }
  return;
}

Assistant:

hash_map(int a = 0, const HashFcn& b = HashFcn(),
           const EqualKey& c = EqualKey(),
           const Alloc& d = Alloc()) : BaseClass(a, b, c, d) {}